

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

parse_buffer * buffer_skip_whitespace(parse_buffer *buffer)

{
  bool bVar1;
  parse_buffer *buffer_local;
  
  if ((buffer == (parse_buffer *)0x0) || (buffer->content == (uchar *)0x0)) {
    buffer_local = (parse_buffer *)0x0;
  }
  else {
    buffer_local = buffer;
    if ((buffer != (parse_buffer *)0x0) && (buffer->offset < buffer->length)) {
      while( true ) {
        bVar1 = false;
        if ((buffer != (parse_buffer *)0x0) && (bVar1 = false, buffer->offset < buffer->length)) {
          bVar1 = buffer->content[buffer->offset] < 0x21;
        }
        if (!bVar1) break;
        buffer->offset = buffer->offset + 1;
      }
      if (buffer->offset == buffer->length) {
        buffer->offset = buffer->offset - 1;
      }
    }
  }
  return buffer_local;
}

Assistant:

static parse_buffer *buffer_skip_whitespace(parse_buffer * const buffer)
{
    if ((buffer == NULL) || (buffer->content == NULL))
    {
        return NULL;
    }

    if (cannot_access_at_index(buffer, 0))
    {
        return buffer;
    }

    while (can_access_at_index(buffer, 0) && (buffer_at_offset(buffer)[0] <= 32))
    {
       buffer->offset++;
    }

    if (buffer->offset == buffer->length)
    {
        buffer->offset--;
    }

    return buffer;
}